

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_FireCGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  AWeapon *pAVar2;
  AActor *pAVar3;
  DPSprite *this;
  FState *pFVar4;
  PClassActor *pufftype;
  bool bVar5;
  bool local_96;
  bool local_93;
  undefined1 local_90 [16];
  int theflash;
  FState *atk;
  FState *local_70;
  FState *flash;
  AWeapon *local_60;
  AWeapon *weapon;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (stateowner != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar5 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_96 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_96 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_96 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar5 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      player = (player_t *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      player = (player_t *)0x0;
    }
    if ((stateowner != (AActor *)0x0) &&
       (weapon = (AWeapon *)stateowner->player, weapon != (AWeapon *)0x0)) {
      local_60 = *(AWeapon **)&(weapon->super_AInventory).super_AActor.sprite;
      if ((local_60 != (AWeapon *)0x0) &&
         (((stateowner->player != (player_t *)0x0 && (player != (player_t *)0x0)) &&
          (*(int *)&player->playerstate == 1)))) {
        bVar5 = AWeapon::DepleteAmmo(local_60,(bool)(local_60->bAltFire & 1),true,1);
        pAVar3 = stateowner;
        if (!bVar5) {
          return 0;
        }
        FSoundID::FSoundID((FSoundID *)((long)&flash + 4),"weapons/chngun");
        S_Sound(pAVar3,1,(FSoundID *)((long)&flash + 4),1.0,1.0);
        pAVar2 = local_60;
        FName::FName((FName *)((long)&atk + 4),NAME_Flash);
        local_70 = AActor::FindState((AActor *)pAVar2,(FName *)((long)&atk + 4));
        pAVar2 = local_60;
        if (local_70 != (FState *)0x0) {
          FName::FName((FName *)(local_90 + 0xc),NAME_Fire);
          _theflash = AActor::FindState((AActor *)pAVar2,(FName *)(local_90 + 0xc));
          this = player_t::GetPSprite((player_t *)weapon,PSP_WEAPON);
          pFVar4 = DPSprite::GetState(this);
          local_90._8_4_ = clamp<int>((int)(((long)pFVar4 - (long)_theflash) / 0x28),0,1);
          if (local_70[(int)local_90._8_4_].sprite != local_70->sprite) {
            local_90._8_4_ = 0;
          }
          P_SetSafeFlash(local_60,(player_t *)weapon,local_70,local_90._8_4_);
        }
      }
      APlayerPawn::PlayAttacking2
                ((APlayerPawn *)
                 (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
      ;
      pAVar3 = stateowner;
      iVar1 = (weapon->super_AInventory).super_AActor.picnum.texnum;
      pufftype = PClass::FindActor(NAME_BulletPuff);
      P_BulletSlope((AActor *)local_90,(FTranslatedLineTarget *)stateowner,0);
      P_GunShot(pAVar3,(bool)(((short)iVar1 != 0 ^ 0xffU) & 1),pufftype,(DAngle *)local_90);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireCGun)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (self == nullptr || nullptr == (player = self->player))
	{
		return 0;
	}

	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
		
		S_Sound (self, CHAN_WEAPON, "weapons/chngun", 1, ATTN_NORM);

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != nullptr)
		{
			// [RH] Fix for Sparky's messed-up Dehacked patch! Blargh!
			FState * atk = weapon->FindState(NAME_Fire);

			int theflash = clamp (int(player->GetPSprite(PSP_WEAPON)->GetState() - atk), 0, 1);

			if (flash[theflash].sprite != flash->sprite)
			{
				theflash = 0;
			}

			P_SetSafeFlash (weapon, player, flash, theflash);
		}

	}
	player->mo->PlayAttacking2 ();

	P_GunShot (self, !player->refire, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}